

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Statement *
slang::ast::ReturnStatement::fromSyntax
          (Compilation *compilation,ReturnStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange assignmentRange;
  bool bVar1;
  SourceLocation this;
  Symbol *pSVar2;
  Type *lhs;
  Type *pTVar3;
  Statement *pSVar4;
  undefined8 in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  SourceRange SVar5;
  ReturnStatement *result;
  DiagCode code;
  Expression *retExpr;
  Type *returnType;
  Symbol *symbol;
  SourceRange stmtRange;
  Scope *scope;
  Statement *in_stack_fffffffffffffee8;
  Compilation *in_stack_fffffffffffffef0;
  Symbol *in_stack_fffffffffffffef8;
  SourceRange *in_stack_ffffffffffffff00;
  Type *in_stack_ffffffffffffff08;
  SourceLocation in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  DiagCode code_00;
  SyntaxNode *in_stack_ffffffffffffff40;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff60;
  Expression *local_88;
  ASTContext *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceLocation SVar6;
  bitmask<slang::ast::StatementFlags> local_2c [4];
  DiagCode DStack_1c;
  long local_18;
  Compilation *local_10;
  ReturnStatement *local_8;
  
  DStack_1c = SUB84((ulong)in_RDX >> 0x20,0);
  local_18 = in_RSI;
  local_10 = in_RDI;
  bitmask<slang::ast::StatementFlags>::bitmask(local_2c,InForkJoin);
  bVar1 = bitmask<slang::ast::StatementFlags>::has
                    ((bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffef0,
                     (bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffee8);
  if (bVar1) {
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff40);
    SVar5.endLoc = in_stack_ffffffffffffff18;
    SVar5.startLoc = in_stack_ffffffffffffff10;
    ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff08,DStack_1c,SVar5);
    local_8 = (ReturnStatement *)
              Statement::badStmt(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    this = (SourceLocation)
           not_null::operator_cast_to_Scope_((not_null<const_slang::ast::Scope_*> *)0xbf5105);
    while( true ) {
      pSVar2 = Scope::asSymbol((Scope *)this);
      code_00 = SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0);
      if (pSVar2->kind != StatementBlock) break;
      pSVar2 = Scope::asSymbol((Scope *)this);
      this = (SourceLocation)Symbol::getParentScope(pSVar2);
    }
    SVar5 = parsing::Token::range((Token *)in_stack_ffffffffffffff10);
    extraFlags.m_bits = (underlying_type)SVar5.startLoc;
    SVar6 = SVar5.endLoc;
    lhs = (Type *)Scope::asSymbol((Scope *)this);
    if (((lhs->super_Symbol).kind == Subroutine) || ((lhs->super_Symbol).kind == RandSeqProduction))
    {
      Symbol::getDeclaredType(in_stack_fffffffffffffef8);
      pTVar3 = DeclaredType::getType((DeclaredType *)in_stack_ffffffffffffff60.m_bits);
      local_88 = (Expression *)0x0;
      if (*(long *)(local_18 + 0x68) == 0) {
        bVar1 = Type::isVoid((Type *)0xbf52d5);
        if (!bVar1) {
          slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff40);
          sourceRange_00.endLoc = in_stack_ffffffffffffff18;
          sourceRange_00.startLoc = in_stack_ffffffffffffff10;
          ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff08,code_00,sourceRange_00);
          pSVar4 = Statement::badStmt(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          return pSVar4;
        }
      }
      else {
        in_stack_ffffffffffffff10 = *(SourceLocation *)(local_18 + 0x68);
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff60,None);
        assignmentRange.endLoc = this;
        assignmentRange.startLoc = SVar6;
        local_88 = Expression::bindRValue
                             (lhs,(ExpressionSyntax *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              assignmentRange,in_stack_ffffffffffffff90,extraFlags);
        in_stack_ffffffffffffff08 = pTVar3;
      }
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff40);
      local_8 = BumpAllocator::
                emplace<slang::ast::ReturnStatement,slang::ast::Expression_const*&,slang::SourceRange>
                          ((BumpAllocator *)in_stack_ffffffffffffff10,
                           (Expression **)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      if ((local_88 != (Expression *)0x0) &&
         (bVar1 = Expression::bad((Expression *)local_10), bVar1)) {
        local_8 = (ReturnStatement *)Statement::badStmt(local_10,in_stack_fffffffffffffee8);
      }
    }
    else {
      sourceRange.endLoc = in_stack_ffffffffffffff18;
      sourceRange.startLoc = in_stack_ffffffffffffff10;
      ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff08,code_00,sourceRange);
      local_8 = (ReturnStatement *)
                Statement::badStmt(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& ReturnStatement::fromSyntax(Compilation& compilation,
                                       const ReturnStatementSyntax& syntax,
                                       const ASTContext& context, StatementContext& stmtCtx) {
    if (stmtCtx.flags.has(StatementFlags::InForkJoin)) {
        context.addDiag(diag::ReturnInParallel, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    // Find the parent subroutine or randsequence production.
    const Scope* scope = context.scope;
    while (scope->asSymbol().kind == SymbolKind::StatementBlock)
        scope = scope->asSymbol().getParentScope();

    auto stmtRange = syntax.returnKeyword.range();
    auto& symbol = scope->asSymbol();
    if (symbol.kind != SymbolKind::Subroutine && symbol.kind != SymbolKind::RandSeqProduction) {
        context.addDiag(diag::ReturnNotInSubroutine, stmtRange);
        return badStmt(compilation, nullptr);
    }

    auto& returnType = symbol.getDeclaredType()->getType();
    const Expression* retExpr = nullptr;
    if (syntax.returnValue) {
        retExpr = &Expression::bindRValue(returnType, *syntax.returnValue, stmtRange, context);
    }
    else if (!returnType.isVoid()) {
        DiagCode code = symbol.kind == SymbolKind::Subroutine ? diag::MissingReturnValue
                                                              : diag::MissingReturnValueProd;
        context.addDiag(code, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    auto result = compilation.emplace<ReturnStatement>(retExpr, syntax.sourceRange());
    if (retExpr && retExpr->bad())
        return badStmt(compilation, result);

    return *result;
}